

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcdgen.h
# Opt level: O2

void __thiscall VcdGen::VcdGenerator::generate_tick_data(VcdGenerator *this)

{
  pointer *pptVar1;
  uint __val;
  uint value;
  unsigned_long __val_00;
  Signal *pSVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  undefined1 auVar5 [8];
  string *psVar6;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  Type data;
  
  get_tick_data();
  std::
  vector<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
  ::vector((vector<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
            *)local_90,&get_tick_data::tick_data.tick_data_);
  std::
  __sort<__gnu_cxx::__normal_iterator<std::tuple<unsigned_long,unsigned_int,VcdGen::Signal_const*>*,std::vector<std::tuple<unsigned_long,unsigned_int,VcdGen::Signal_const*>,std::allocator<std::tuple<unsigned_long,unsigned_int,VcdGen::Signal_const*>>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_90,data.
                      super__Vector_base<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  psVar6 = &this->vcd_data_;
  uVar3 = 0xffffffffffffffff;
  for (auVar5 = local_90;
      auVar5 != (undefined1  [8])
                data.
                super__Vector_base<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      auVar5 = (undefined1  [8])((long)auVar5 + 0x18)) {
    __val_00 = (((pointer)auVar5)->
               super__Tuple_impl<0UL,_unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>).
               super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    __val = (((pointer)auVar5)->
            super__Tuple_impl<0UL,_unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>).
            super__Tuple_impl<1UL,_unsigned_int,_const_VcdGen::Signal_*>.
            super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
    pSVar2 = (((pointer)auVar5)->
             super__Tuple_impl<0UL,_unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>).
             super__Tuple_impl<1UL,_unsigned_int,_const_VcdGen::Signal_*>.
             super__Tuple_impl<2UL,_const_VcdGen::Signal_*>.
             super__Head_base<2UL,_const_VcdGen::Signal_*,_false>._M_head_impl;
    value = pSVar2->width_;
    uVar4 = __val_00;
    if (uVar3 != __val_00) {
      std::__cxx11::to_string(&local_d0,__val_00);
      std::operator+(&local_b0,"#",&local_d0);
      pptVar1 = &data.
                 super__Vector_base<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pptVar1,
                     &local_b0,"\n");
      std::__cxx11::string::append((string *)psVar6);
      std::__cxx11::string::~string((string *)pptVar1);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    if (value < 2) {
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &data.
            super__Vector_base<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::to_string(__return_storage_ptr__,__val);
      std::__cxx11::string::append((string *)psVar6);
    }
    else {
      convert_to_binary_abi_cxx11_(&local_b0,(VcdGen *)(ulong)__val,value,(uint32_t)uVar4);
      pptVar1 = &data.
                 super__Vector_base<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pptVar1,
                     &local_b0," ");
      std::__cxx11::string::append((string *)psVar6);
      std::__cxx11::string::~string((string *)pptVar1);
      __return_storage_ptr__ = &local_b0;
    }
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    std::__cxx11::string::string((string *)&local_b0,(string *)&pSVar2->encoded_name_);
    pptVar1 = &data.
               super__Vector_base<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pptVar1,
                   &local_b0,"\n");
    std::__cxx11::string::append((string *)psVar6);
    std::__cxx11::string::~string((string *)pptVar1);
    std::__cxx11::string::~string((string *)&local_b0);
    uVar3 = __val_00;
  }
  std::
  _Vector_base<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
  ::~_Vector_base((_Vector_base<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
                   *)local_90);
  return;
}

Assistant:

void generate_tick_data(){
        TickData &tick_data = get_tick_data();
        
        auto data = tick_data.get_data();

        sort(data.begin(), data.end());

        uint64_t tick_prev = -1;
        for( auto& d : data ) {

            #ifdef VCDGEN_DEBUG
                cout << "Time : " << get<0>(d) << "\t| Value : " << get<1>(d) << "\t| Name : " 
                     << get<2>(d)->get_name() << "\t| Symbol : " << get<2>(d)->get_encoded_name() 
                     << endl;
            #endif

            uint64_t tick  = get<0>(d); 
            uint32_t value = get<1>(d);
            const Signal* signal  = get<2>(d); 
            uint32_t width = signal->get_width();

            if( tick_prev != tick ){
                vcd_data_ += "#" + to_string(tick) + "\n";
            }
            if( width > 1 ){ 
                vcd_data_ += convert_to_binary(value, width) + " " ;
            } else {
                vcd_data_ += to_string(value);
            }
            vcd_data_ += signal->get_encoded_name() + "\n";
            tick_prev = tick;
        }
    }